

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::Add<Js::JavascriptString*>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,
          JavascriptString *propertyKey,PropertyAttributes attributes,bool isInitialized,
          bool isFixed,bool usedAsFixed,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  bool usedAsFixed_local;
  bool isFixed_local;
  bool isInitialized_local;
  PropertyAttributes attributes_local;
  JavascriptString *propertyKey_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_local;
  
  iVar3 = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)this);
  if (0x3fffffff < iVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fa,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  iVar3 = *(int *)(this + 0x2c);
  iVar4 = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)this);
  if (iVar4 <= iVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fb,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  iVar3 = ::Math::PostInc<int>((int *)(this + 0x2c));
  Add<Js::JavascriptString*>
            (this,iVar3,propertyKey,attributes,isInitialized,isFixed,usedAsFixed,scriptContext);
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready

        Add(::Math::PostInc(nextPropertyIndex), propertyKey, attributes, isInitialized, isFixed, usedAsFixed, scriptContext);
    }